

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  swap(this,other);
  return this;
}

Assistant:

Value& Value::operator=(Value other) {
  swap(other);
  return *this;
}